

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_delete_selection(ImGuiInputTextState *str,STB_TexteditState *state)

{
  ImGuiInputTextState *in_RSI;
  STB_TexteditState *in_stack_ffffffffffffffe8;
  
  stb_textedit_clamp(in_RSI,in_stack_ffffffffffffffe8);
  if (in_RSI->CurLenW != in_RSI->CurLenA) {
    if (in_RSI->CurLenW < in_RSI->CurLenA) {
      stb_textedit_delete(in_RSI,in_stack_ffffffffffffffe8,0,0x220a7c);
      in_RSI->ID = in_RSI->CurLenW;
      in_RSI->CurLenA = in_RSI->CurLenW;
    }
    else {
      stb_textedit_delete(in_RSI,in_stack_ffffffffffffffe8,0,0x220abc);
      in_RSI->ID = in_RSI->CurLenA;
      in_RSI->CurLenW = in_RSI->CurLenA;
    }
    in_RSI->field_0xf = 0;
  }
  return;
}

Assistant:

static void stb_textedit_delete_selection(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   stb_textedit_clamp(str, state);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start < state->select_end) {
         stb_textedit_delete(str, state, state->select_start, state->select_end - state->select_start);
         state->select_end = state->cursor = state->select_start;
      } else {
         stb_textedit_delete(str, state, state->select_end, state->select_start - state->select_end);
         state->select_start = state->cursor = state->select_end;
      }
      state->has_preferred_x = 0;
   }
}